

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_2c92::ndiBX2Helper(ndicapi *api,char *command,char *commandReply)

{
  long lVar1;
  char *replyIndex;
  
  if (*command == -0x38) {
    if (command[1] != -0x5b) {
      return;
    }
    api->Bx2ReplyLength = 0;
    api->Bx2ReplyLength = *(uint *)command;
    lVar1 = 4;
  }
  else {
    if ((*command != -0x3c) || (command[1] != -0x5b)) {
      return;
    }
    api->Bx2ReplyLength = 0;
    api->Bx2ReplyLength = (uint)*(ushort *)(command + 2);
    lVar1 = 6;
  }
  parseComponents(api,command + lVar1);
  return;
}

Assistant:

void ndiBX2Helper(ndicapi* api, const char* command, const char* commandReply)
  {
    // Reply options
    // --6d = tools | none Specifies whether 6D information for tools is returned.The default is tools.
    // --3d = none | tools | strays | all Specifies which 3D information is returned(none, tool 3Ds, stray 3Ds, or all 3Ds). The default is none.If selected, 3Ds are returned for all frame types, not just passive frames.
    // --2d = none | tools | strays | all Specifies which 2D(line of sight) information is returned. The default is none.
    // --sensor = none | tools | strays | all Specifies which scaled sensor UV information is returned. Scaled UV can be used to visualize the images on the sensors and also provide diagnostic information related to UV brightness.The default is none.
    // --1d = buttons | none Specifies whether buttons are reported.The default is buttons.

    /* BX2 replies are in General Binary Format 
    * 
    * GBF is a container format that packages data components
    * Each data component has a 12 byte header
    * From the data component header, the data component can be parsed
    * 
    * ----------------------------
    * | GBF Version 2 bytes      |
    * ----------------------------
    * | Component Count          |
    * | 2 bytes                  |
    * ----------------------------
    * | ------------------------ |
    * | |DataComponent1        | |
    * | | -------------------- | |
    * | | | Component Header | | |
    * | | |                  | | |
    * | | | Component Type 2 | | |
    * | | | Component Size 4 | | |
    * | | | Item Format    2 | | |
    * | | | Item Count     4 | | |
    * | | -------------------- | |
    * | | | ---------------- | | |
    * | | | | Items        | | | |
    * | | | | -----------  | | | |
    * | | | | | Item1   |  | | | |
    * | | | | -----------  | | | |
    * | | | | -----------  | | | |
    * | | | | | Item2   |  | | | |
    * | | | | -----------  | | | |
    * | | | |   ...        | | | |
    * | | | | -----------  | | | |
    * | | | | | ItemX   |  | | | |
    * | | | | -----------  | | | |
    * | | | ---------------- | | |
    * | | -------------------- | |
    * | ------------------------ |
    * | ------------------------ |
    * | |DataComponent2        | |
    * | ------------------------ |
    * | ------------------------ |
    * | |DataComponent3        | |
    * | ------------------------ |
    * ----------------------------
    *
    * Items each have a specific format
    * 
    * -------------------------------
    * Frame Component: a container component that holds a GBF in its payload
    *   Frame Type            1 byte - Frame Types are as follows:
    *     0: DUMMY
    *     1: ACTIVE_WIRELESS
    *     2: PASSIVE
    *     3: ACTIVE
    *     4: LASER
    *     5: ILLUMINATED
    *     6: BACKGROUND
    *     7: MAGNETIC
    *   Frame Sequence Index  2 bytes
    *   Frame Status          2 bytes - For bits 0 to 15, the field uses the same codes as the 6D Port/Tool Status, but only the ones which are applicable to the frame as a whole.
    *   Frame Number          4 bytes
    *   Frame Timestamp*      8 bytes struct timespec � Bytes 0-3: seconds since the start of the Unix epoch (1-Jan-1970 00:00:00 UTC) � Bytes 4-7: nanoseconds
    *   Frame Data            Payload Variable - General Binary Format
    *   
    * ------------------------------
    * 6D Data Component
    *   Tool Handle                       2 bytes
    *   Status                            2 bytes - See below
    *   Q0, Qx, Qy, Qz, Tx, Ty, Tz, Error 4 bytes each
    * 
    *   Tool Status
    *     Bit 0-7 Error codes as described in Port/Tool Status Error Codes.
    *     Bit 8 Transform missing
    *     Bit 9 Averaging Enabled
    *     Bit 10-12 Reserved
    *     Bit 13-15 Which face of a multi-face tool is being tracked
    * 
    * ------------------------------
    * 3D Data Component
    *   Tool Handle Reference 2 bytes - 0xffff for �stray� 3D
    *   Number of 3Ds         2 bytes
    *   Status                1 byte - See below
    *   -reserved-            1 byte
    *   Marker Index          2 bytes - index of marker on tool, sequential # for strays
    *   X, Y, Z               4 bytes each
    * 
    *   Marker Status
    *     0x00 OK
    *     0x01 Missing (missing markers may not be reported in component at all)
    *     0x02 Not used: exceeded max marker angle
    *     0x03 Not used: exceeded max marker error for tool
    *     0x04 Not used: Out of Volume
    *     0x05 Out of Volume � used in 6D
    *     0x06 Possible phantom marker (in volume, applies to stray markers only)
    *     0x07 Saturated (in or out of volume, not used in 6D)
    *     0x08 Saturated and out of volume (not used in 6D)
    *     0x09 to 0xFF Reserved
    * 
    * For other components see API documentation
    */

    const char* replyIndex = &commandReply[0];
    unsigned short headerCRC;
    bool extendedHeader = false;

    // Confirm start sequence
    if (replyIndex[0] != (char)0xc4 || replyIndex[1] != (char)0xa5)  // little endian
    {
      if (replyIndex[0] != (char)0xc8 || replyIndex[1] != (char)0xa5)  // little endian
      {
        return;
      }
      else
      {
        extendedHeader = true;

        // Get the reply length
        api->Bx2ReplyLength = 0;
        api->Bx2ReplyLength = (unsigned char)replyIndex[3] << 24 | (unsigned char)replyIndex[2] << 16 | (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
        replyIndex += 4;
      }
    }
    else
    {
      replyIndex += 2;

      // Get the reply length
      api->Bx2ReplyLength = 0;
      api->Bx2ReplyLength = 0 << 24 | 0 << 16 | (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
      replyIndex += 2;

      // Get the CRC
      headerCRC = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
      replyIndex += 2;
    }

    parseComponents(api, replyIndex);
  }